

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O2

bool __thiscall
XPMP2::RmtMsgBufTy<XPMP2::RemoteAcRemoveTy,_(XPMP2::RemoteMsgTy)6,_(unsigned_char)'\x00'>::add
          (RmtMsgBufTy<XPMP2::RemoteAcRemoveTy,_(XPMP2::RemoteMsgTy)6,_(unsigned_char)__x00_> *this,
          RemoteAcRemoveTy *_elem)

{
  ulong uVar1;
  
  if (this->pMsg == (void *)0x0) {
    init(this,(EVP_PKEY_CTX *)_elem);
  }
  uVar1 = DAT_002cc788 - this->size;
  if (3 < uVar1) {
    *(uint32_t *)((long)this->pMsg + this->size) = _elem->modeS_id;
    this->elemCount = this->elemCount + 1;
    this->size = this->size + 4;
  }
  return 3 < uVar1;
}

Assistant:

bool RmtMsgBufTy<ElemTy,MsgTy,msgVer>::add (const ElemTy& _elem)
{
    // no buffer defined yet? -> do so!
    if (!pMsg) init();
        
    // no space left?
    const size_t elemSize = _elem.msgSize();
    if (glob.remoteBufSize - size < elemSize)
        return false;
    
    // Copy the element into the msg buffer
    memcpy(reinterpret_cast<char*>(pMsg) + size, &_elem, elemSize);
    ++elemCount;
    size += elemSize;
    return true;
}